

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O3

size_t ans_smsb_compress<40u>(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  array<unsigned_long,_4UL> states;
  ans_smsb_encode<40U> ans_frame;
  uint8_t *local_a8;
  size_t local_a0;
  uint8_t *local_98;
  uint64_t local_90 [4];
  ans_smsb_encode<40U> local_70;
  
  ans_smsb_encode<40U>::create(&local_70,src,srcSize);
  local_a8 = dst;
  ans_serialize_interp(&local_70.nfreqs,local_70.frame_size,&local_a8);
  local_90[0] = local_70.lower_bound;
  local_90[1] = local_70.lower_bound;
  local_90[2] = local_70.lower_bound;
  local_90[3] = local_70.lower_bound;
  local_98 = dst;
  if ((srcSize & 3) == 0) {
    sVar3 = 0;
  }
  else {
    uVar5 = (ulong)((uint)srcSize & 3);
    lVar4 = 0;
    local_a0 = uVar5;
    do {
      ans_smsb_encode<40U>::encode_symbol(&local_70,local_90,src[srcSize + lVar4 + -1],&local_a8);
      lVar4 = lVar4 + -1;
      sVar3 = local_a0;
    } while (-lVar4 != uVar5);
  }
  if (sVar3 != srcSize) {
    uVar5 = srcSize & 0xfffffffffffffffc;
    do {
      ans_smsb_encode<40U>::encode_symbol(&local_70,local_90,src[uVar5 - 1],&local_a8);
      ans_smsb_encode<40U>::encode_symbol(&local_70,local_90 + 1,src[uVar5 - 2],&local_a8);
      ans_smsb_encode<40U>::encode_symbol(&local_70,local_90 + 2,src[uVar5 - 3],&local_a8);
      ans_smsb_encode<40U>::encode_symbol(&local_70,local_90 + 3,src[uVar5 - 4],&local_a8);
      uVar5 = uVar5 - 4;
    } while (uVar5 != 0);
  }
  puVar2 = local_98;
  puVar1 = local_a8;
  lVar4 = 0;
  do {
    *(uint64_t *)(local_a8 + lVar4) = *(long *)((long)local_90 + lVar4) - local_70.lower_bound;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  if (local_70.table.super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.table.
                    super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.table.
                          super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.table.
                          super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (size_t)(puVar1 + (0x20 - (long)puVar2));
}

Assistant:

size_t ans_smsb_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    const uint32_t num_states = 4;
#ifdef RECORD_STATS
    auto start_compress = std::chrono::high_resolution_clock::now();
#endif

    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_smsb_encode<H_approx>::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    std::array<uint64_t, num_states> states;

    // start encoding
    for (uint32_t i = 0; i < num_states; i++)
        states[i] = ans_frame.initial_state();

#ifdef RECORD_STATS
    auto stop_prelude = std::chrono::high_resolution_clock::now();
    get_stats().prelude_bytes = out_u8 - reinterpret_cast<uint8_t*>(dst);
    get_stats().prelude_time_ns = (stop_prelude - start_compress).count();
#endif

    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % num_states != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += num_states;
    }

    // flush final state
    for (uint32_t i = 0; i < num_states; i++)
        ans_frame.flush_state(states[i], out_u8);

#ifdef RECORD_STATS
    auto stop_compress = std::chrono::high_resolution_clock::now();
    get_stats().encode_bytes = (out_u8 - reinterpret_cast<uint8_t*>(dst))
        - get_stats().prelude_bytes;
    get_stats().encode_time_ns = (stop_compress - stop_prelude).count();
#endif

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}